

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O0

bool loadSphereMeshBuffers(void)

{
  GLboolean GVar1;
  GLenum GVar2;
  djg_mesh *mesh_00;
  djgm_vertex *pdVar3;
  uint16_t *puVar4;
  uint16_t *indexes;
  djgm_vertex *vertices;
  djg_mesh *mesh;
  int indexCnt;
  int vertexCnt;
  
  mesh_00 = djgm_load_hemisphere(g_sphere.sphere.xTess,g_sphere.sphere.yTess);
  pdVar3 = djgm_get_vertices(mesh_00,(GLint *)((long)&mesh + 4));
  puVar4 = djgm_get_triangles(mesh_00,(GLint *)&mesh);
  GVar1 = (*glad_glIsBuffer)(g_gl.buffers[0]);
  if (GVar1 != '\0') {
    (*glad_glDeleteBuffers)(1,g_gl.buffers);
  }
  GVar1 = (*glad_glIsBuffer)(g_gl.buffers[1]);
  if (GVar1 != '\0') {
    (*glad_glDeleteBuffers)(1,g_gl.buffers + 1);
  }
  fprintf(_stdout,"Loading {Mesh-Vertex-Buffer}\n");
  fflush(_stdout);
  (*glad_glGenBuffers)(1,g_gl.buffers);
  (*glad_glBindBuffer)(0x8892,g_gl.buffers[0]);
  (*glad_glBufferData)(0x8892,(long)mesh._4_4_ << 6,pdVar3,0x88e4);
  (*glad_glBindBuffer)(0x8892,0);
  fprintf(_stdout,"Loading {Mesh-Grid-Index-Buffer}\n");
  fflush(_stdout);
  (*glad_glGenBuffers)(1,g_gl.buffers + 1);
  (*glad_glBindBuffer)(0x8893,g_gl.buffers[1]);
  (*glad_glBufferData)(0x8893,(long)(int)mesh << 1,puVar4,0x88e4);
  (*glad_glBindBuffer)(0x8893,0);
  g_sphere.sphere.indexCnt = (int)mesh;
  g_sphere.sphere.vertexCnt = mesh._4_4_;
  djgm_release(mesh_00);
  GVar2 = (*glad_glGetError)();
  return GVar2 == 0;
}

Assistant:

bool loadSphereMeshBuffers()
{
    int vertexCnt, indexCnt;
    djg_mesh *mesh = djgm_load_hemisphere(
        g_sphere.sphere.xTess, g_sphere.sphere.yTess
    );
    const djgm_vertex *vertices = djgm_get_vertices(mesh, &vertexCnt);
    const uint16_t *indexes = djgm_get_triangles(mesh, &indexCnt);

    if (glIsBuffer(g_gl.buffers[BUFFER_SPHERE_VERTICES]))
        glDeleteBuffers(1, &g_gl.buffers[BUFFER_SPHERE_VERTICES]);
    if (glIsBuffer(g_gl.buffers[BUFFER_SPHERE_INDEXES]))
        glDeleteBuffers(1, &g_gl.buffers[BUFFER_SPHERE_INDEXES]);

    LOG("Loading {Mesh-Vertex-Buffer}\n");
    glGenBuffers(1, &g_gl.buffers[BUFFER_SPHERE_VERTICES]);
    glBindBuffer(GL_ARRAY_BUFFER, g_gl.buffers[BUFFER_SPHERE_VERTICES]);
    glBufferData(GL_ARRAY_BUFFER,
                 sizeof(djgm_vertex) * vertexCnt,
                 (const void*)vertices,
                 GL_STATIC_DRAW);
    glBindBuffer(GL_ARRAY_BUFFER, 0);

    LOG("Loading {Mesh-Grid-Index-Buffer}\n");
    glGenBuffers(1, &g_gl.buffers[BUFFER_SPHERE_INDEXES]);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, g_gl.buffers[BUFFER_SPHERE_INDEXES]);
    glBufferData(GL_ELEMENT_ARRAY_BUFFER,
                 sizeof(uint16_t) * indexCnt,
                 (const void *)indexes,
                 GL_STATIC_DRAW);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

    g_sphere.sphere.indexCnt = indexCnt;
    g_sphere.sphere.vertexCnt = vertexCnt;
    djgm_release(mesh);

    return (glGetError() == GL_NO_ERROR);
}